

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O1

deUint32 vkt::sr::anon_unknown_0::getNextMultiple
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *divisors,deUint32 value)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  deUint32 dVar4;
  ulong uVar5;
  uint uVar6;
  deUint32 nextMultiple;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  puVar1 = (divisors->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (divisors->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar8 = (long)puVar2 - (long)puVar1 >> 2;
  if (puVar2 != puVar1) {
    uVar5 = (ulong)value;
    do {
      dVar4 = (deUint32)uVar5;
      bVar9 = true;
      lVar7 = 0;
      do {
        if (bVar9) {
          bVar9 = (int)(uVar5 % (ulong)puVar1[lVar7]) == 0;
        }
        else {
          bVar9 = false;
        }
        lVar7 = lVar7 + 1;
      } while (lVar8 + (ulong)(lVar8 == 0) != lVar7);
      if (bVar9) {
        return dVar4;
      }
      uVar6 = (dVar4 + 1) % *puVar1;
      uVar3 = (dVar4 + *puVar1 + 1) - uVar6;
      if (uVar6 == 0) {
        uVar3 = dVar4 + 1;
      }
      uVar5 = (ulong)uVar3;
    } while (puVar2 != puVar1);
  }
  return value;
}

Assistant:

static deUint32 getNextMultiple (const std::vector<deUint32>& divisors, deUint32 value)
{
	deUint32	nextMultiple		= value;
	bool		nextMultipleFound	= false;

	while (true)
	{
		nextMultipleFound = true;

		for (size_t divNdx = 0; divNdx < divisors.size(); divNdx++)
			nextMultipleFound = nextMultipleFound && (nextMultiple % divisors[divNdx] == 0);

		if (nextMultipleFound)
			break;

		DE_ASSERT(nextMultiple < ~((deUint32)0u));
		nextMultiple = getNextMultiple(divisors[0], nextMultiple + 1);
	}

	return nextMultiple;
}